

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O0

void Assimp::DefaultLogger::set(Logger *logger)

{
  bool bVar1;
  Logger *local_10;
  Logger *logger_local;
  
  local_10 = logger;
  if (logger == (Logger *)0x0) {
    local_10 = (Logger *)&s_pNullLogger;
  }
  if (((m_pLogger != (undefined *)0x0) && (bVar1 = isNullLogger(), !bVar1)) &&
     (m_pLogger != (undefined *)0x0)) {
    (**(code **)(*(long *)m_pLogger + 8))();
  }
  m_pLogger = (undefined *)local_10;
  return;
}

Assistant:

void DefaultLogger::set( Logger *logger ) {
    // enter the mutex here to avoid concurrency problems
#ifndef ASSIMP_BUILD_SINGLETHREADED
    std::lock_guard<std::mutex> lock(loggerMutex);
#endif

    if ( nullptr == logger ) {
        logger = &s_pNullLogger;
    }
    if ( nullptr != m_pLogger && !isNullLogger() ) {
        delete m_pLogger;
    }

    DefaultLogger::m_pLogger = logger;
}